

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O3

AMQP_VALUE on_message_received(void *context,MESSAGE_HANDLE message)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE key;
  AMQP_VALUE value;
  AMQP_VALUE pAVar6;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar7;
  char *pcVar8;
  int32_t status_code;
  char *status_description;
  PROPERTIES_HANDLE response_properties;
  AMQP_VALUE application_properties;
  uint64_t correlation_id;
  AMQP_VALUE correlation_id_value;
  int local_6c;
  char *local_68;
  AMQP_VALUE local_60;
  PROPERTIES_HANDLE local_58;
  AMQP_VALUE local_50;
  AMQP_VALUE local_48;
  uint64_t local_40;
  AMQP_VALUE local_38;
  
  if (context == (void *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x49,1,"NULL context in on_message_received");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  iVar3 = message_get_application_properties(message,&local_50);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x55,1,"Could not retrieve application properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar5 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get application properties on AMQP management response.");
    return pAVar5;
  }
  iVar3 = message_get_properties(message,&local_58);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x62,1,"Could not retrieve message properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar5 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get message properties on AMQP management response.");
    goto LAB_00173b32;
  }
  iVar3 = properties_get_correlation_id(local_58,&local_38);
  if (iVar3 == 0) {
    iVar3 = amqpvalue_get_ulong(local_38,&local_40);
    if (iVar3 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar8 = "Could not retrieve correlation Id ulong value";
        iVar3 = 0x7f;
        goto LAB_00173b00;
      }
      goto LAB_00173b0b;
    }
    pAVar5 = amqpvalue_get_inplace_described_value(local_50);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                  ,"on_message_received",0x8c,1,"Could not retrieve application property map");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pcVar8 = 
      "Could not get application property map from the application properties in the AMQP management response."
      ;
      goto LAB_00173b20;
    }
    key = amqpvalue_create_string(*(char **)((long)context + 0x58));
    if (key == (AMQP_VALUE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                  ,"on_message_received",0x99,1,"Could not create status-code amqp value");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pAVar5 = messaging_delivery_released();
    }
    else {
      value = amqpvalue_get_map_value(pAVar5,key);
      if (value == (AMQP_VALUE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                    ,"on_message_received",0xa5,1,
                    "Could not retrieve status code from application properties");
        }
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        pAVar5 = messaging_delivery_rejected
                           ("amqp:internal-error",
                            "Could not retrieve status code from the application properties in the AMQP management response."
                           );
      }
      else {
        iVar3 = amqpvalue_get_int(value,&local_6c);
        if (iVar3 == 0) {
          pAVar6 = amqpvalue_create_string(*(char **)((long)context + 0x60));
          if (pAVar6 == (AMQP_VALUE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                        ,"on_message_received",0xbe,1,
                        "Could not create status-description amqp value");
            }
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
            pAVar5 = messaging_delivery_released();
          }
          else {
            local_68 = (char *)0x0;
            local_48 = amqpvalue_get_map_value(pAVar5,pAVar6);
            local_60 = pAVar6;
            if ((local_48 == (AMQP_VALUE)0x0) ||
               (iVar3 = amqpvalue_get_string(local_48,&local_68), iVar3 != 0)) {
              local_68 = (char *)0x0;
            }
            for (item_handle = singlylinkedlist_get_head_item
                                         (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20));
                item_handle != (LIST_ITEM_HANDLE)0x0;
                item_handle = singlylinkedlist_get_next_item(item_handle)) {
              puVar7 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
              if (puVar7 == (undefined8 *)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                            ,"on_message_received",0xe3,1,
                            "Could not create status-description amqp value");
                }
                (**(code **)((long)context + 0x40))();
                messaging_delivery_released();
                break;
              }
              if (local_40 == puVar7[2]) {
                if (*(char *)(puVar7 + 3) == '\0') {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                              ,"on_message_received",0xf4,1,
                              "Did not receive send confirmation for pending operation");
                  }
                  iVar3 = async_operation_cancel((ASYNC_OPERATION_HANDLE)puVar7[5]);
                  cVar2 = '\x03';
                  if (iVar3 == 0) goto LAB_00173f0f;
                  p_Var4 = xlogging_get_log_function();
                  bVar1 = true;
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                              ,"on_message_received",0xf9,1,
                              "Failed cancelling pending send operation");
                  }
                }
                else {
                  cVar2 = (local_6c - 300U < 0xffffff9c) * '\x02' + '\x01';
LAB_00173f0f:
                  bVar1 = false;
                }
                if ((code *)*puVar7 != (code *)0x0) {
                  (*(code *)*puVar7)(puVar7[1],cVar2,local_6c,local_68,message);
                }
                async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar7[6]);
                iVar3 = singlylinkedlist_remove
                                  (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20),item_handle);
                pAVar6 = local_60;
                if (iVar3 == 0) {
                  if (!bVar1) {
                    pAVar5 = messaging_delivery_accepted();
                    goto LAB_00173fa7;
                  }
                }
                else {
                  p_Var4 = xlogging_get_log_function();
                  pAVar6 = local_60;
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                              ,"on_message_received",0x117,1,"Cannot remove pending operation");
                  }
                }
                (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
                pAVar5 = messaging_delivery_released();
                goto LAB_00173fa7;
              }
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                        ,"on_message_received",0x134,1,
                        "Could not match AMQP management response to request");
            }
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
            pAVar5 = messaging_delivery_rejected
                               ("amqp:internal-error",
                                "Could not match AMQP management response to request");
            pAVar6 = local_60;
LAB_00173fa7:
            if (local_48 != (AMQP_VALUE)0x0) {
              amqpvalue_destroy(local_48);
            }
            amqpvalue_destroy(pAVar6);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                      ,"on_message_received",0xb1,1,"Could not retrieve status code int value");
          }
          (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
          pAVar5 = messaging_delivery_rejected
                             ("amqp:internal-error",
                              "Could not retrieve status code value from the application properties in the AMQP management response."
                             );
        }
        amqpvalue_destroy(value);
      }
      amqpvalue_destroy(key);
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar8 = "Could not retrieve correlation Id";
      iVar3 = 0x75;
LAB_00173b00:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",iVar3,1,pcVar8);
    }
LAB_00173b0b:
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pcVar8 = "Could not get correlation Id from AMQP management response.";
LAB_00173b20:
    pAVar5 = messaging_delivery_rejected("amqp:internal-error",pcVar8);
  }
  properties_destroy(local_58);
LAB_00173b32:
  amqpvalue_destroy(local_50);
  return pAVar5;
}

Assistant:

static AMQP_VALUE on_message_received(const void* context, MESSAGE_HANDLE message)
{
    PROPERTIES_HANDLE properties;
    /* VS believes this is not initialized, so have to set it to the worse case here */
    AMQP_VALUE result = NULL;
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    MESSAGE_OUTCOME message_outcome;

    if (message == NULL)
    {
        LogError("NULL message");
        message_outcome = MESSAGE_OUTCOME_RELEASED;
    }
    else
    {
        if (message_get_properties(message, &properties) != 0)
        {
            LogError("Cannot retrieve message properties");
            message_outcome = MESSAGE_OUTCOME_REJECTED;
            result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve message properties");
        }
        else
        {
            AMQP_VALUE correlation_id;

            if (properties_get_correlation_id(properties, &correlation_id) != 0)
            {
                LogError("Cannot retrieve correlation id");
                message_outcome = MESSAGE_OUTCOME_REJECTED;
                result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve correlation id");
            }
            else
            {
                IOTHUBTRANSPORT_AMQP_METHOD* method_handle = (IOTHUBTRANSPORT_AMQP_METHOD*)malloc(sizeof(IOTHUBTRANSPORT_AMQP_METHOD));
                if (method_handle == NULL)
                {
                    LogError("Cannot allocate method handle");
                    message_outcome = MESSAGE_OUTCOME_RELEASED;
                }
                else
                {
                    IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
                    size_t realloc_size = safe_multiply_size_t(safe_add_size_t(amqp_methods_handle->method_request_handle_count, 1), sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
                    if (realloc_size == SIZE_MAX || 
                        (new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) == NULL)
                    {
                        free(method_handle);
                        LogError("Cannot grow method handles array, size:%zu", realloc_size);
                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                    }
                    else
                    {
                        amqp_methods_handle->method_request_handles = new_handles;

                        if (amqpvalue_get_uuid(correlation_id, &method_handle->correlation_id) != 0)
                        {
                            free(method_handle);
                            LogError("Cannot get uuid value for correlation-id");
                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                            result = messaging_delivery_rejected("amqp:decode-error", "Cannot get uuid value for correlation-id");
                        }
                        else
                        {
                            BINARY_DATA binary_data;

                            if (message_get_body_amqp_data_in_place(message, 0, &binary_data) != 0)
                            {
                                free(method_handle);
                                LogError("Cannot get method request message payload");
                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot get method request message payload");
                            }
                            else
                            {
                                AMQP_VALUE application_properties;

                                if (message_get_application_properties(message, &application_properties) != 0)
                                {
                                    LogError("Cannot get application properties");
                                    free(method_handle);
                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot get application properties");
                                }
                                else
                                {
                                    AMQP_VALUE amqp_properties_map = amqpvalue_get_inplace_described_value(application_properties);
                                    if (amqp_properties_map == NULL)
                                    {
                                        LogError("Cannot get application properties map");
                                        free(method_handle);
                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                    }
                                    else
                                    {
                                        AMQP_VALUE property_key = amqpvalue_create_string("IoThub-methodname");
                                        if (property_key == NULL)
                                        {
                                            LogError("Cannot create the property key for method name");
                                            free(method_handle);
                                            message_outcome = MESSAGE_OUTCOME_RELEASED;
                                        }
                                        else
                                        {
                                            AMQP_VALUE property_value = amqpvalue_get_map_value(amqp_properties_map, property_key);
                                            if (property_value == NULL)
                                            {
                                                LogError("Cannot find the IoThub-methodname property in the properties map");
                                                free(method_handle);
                                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot find the IoThub-methodname property in the properties map");
                                            }
                                            else
                                            {
                                                const char* method_name;

                                                if (amqpvalue_get_string(property_value, &method_name) != 0)
                                                {
                                                    LogError("Cannot read the method name from the property value");
                                                    free(method_handle);
                                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot read the method name from the property value");
                                                }
                                                else
                                                {
                                                    result = messaging_delivery_accepted();
                                                    if (result == NULL)
                                                    {
                                                        LogError("Cannot allocate memory for delivery state");
                                                        free(method_handle);
                                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                                    }
                                                    else
                                                    {
                                                        method_handle->iothubtransport_amqp_methods_handle = amqp_methods_handle;

                                                        /* set the method request handle in the handle array */
                                                        amqp_methods_handle->method_request_handles[amqp_methods_handle->method_request_handle_count] = method_handle;
                                                        amqp_methods_handle->method_request_handle_count++;

                                                        if (amqp_methods_handle->on_method_request_received(amqp_methods_handle->on_method_request_received_context, method_name, binary_data.bytes, binary_data.length, method_handle) != 0)
                                                        {
                                                            LogError("Cannot execute the callback with the given data");
                                                            amqpvalue_destroy(result);
                                                            free(method_handle);
                                                            amqp_methods_handle->method_request_handle_count--;
                                                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                            result = messaging_delivery_rejected("amqp:internal-error", "Cannot execute the callback with the given data");
                                                        }
                                                        else
                                                        {
                                                            message_outcome = MESSAGE_OUTCOME_ACCEPTED;
                                                        }
                                                    }
                                                }

                                                amqpvalue_destroy(property_value);
                                            }

                                            amqpvalue_destroy(property_key);
                                        }
                                    }

                                    application_properties_destroy(application_properties);
                                }
                            }
                        }
                    }
                }
            }

            properties_destroy(properties);
        }
    }

    switch (message_outcome)
    {
    default:
        break;

    case MESSAGE_OUTCOME_RELEASED:
        result = messaging_delivery_released();

        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
        break;

    case MESSAGE_OUTCOME_REJECTED:
    case MESSAGE_OUTCOME_ACCEPTED:
        /* all is well */
        break;
    }

    return result;
}